

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

BigInt * __thiscall BigInt::operator-(BigInt *__return_storage_ptr__,BigInt *this,BigInt *b)

{
  bool bVar1;
  undefined1 local_40 [8];
  BigInt temp;
  BigInt *b_local;
  BigInt *this_local;
  
  temp._24_8_ = b;
  BigInt((BigInt *)local_40,b);
  bVar1 = get_positive_sign((BigInt *)temp._24_8_);
  set_sign((BigInt *)local_40,!bVar1);
  add(__return_storage_ptr__,this,(BigInt *)local_40);
  ~BigInt((BigInt *)local_40);
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::operator-(BigInt&& b) {
    BigInt temp = b;
    temp.set_sign(!b.get_positive_sign());
    return this->add(temp);
}